

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true> *this,
          pair<const_char_*,_llvm::cl::Option_*> *Elt)

{
  undefined8 *puVar1;
  uint uVar2;
  Option *pOVar3;
  
  if ((this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>).
      super_SmallVectorBase.Size) {
    SmallVectorTemplateBase<std::pair<char_const*,llvm::cl::Option*>,true>::push_back(this);
  }
  pOVar3 = Elt->second;
  puVar1 = (undefined8 *)
           ((long)(this->
                  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                  ).super_SmallVectorBase.BeginX +
           (ulong)(this->
                  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                  ).super_SmallVectorBase.Size * 0x10);
  *puVar1 = Elt->first;
  puVar1[1] = pOVar3;
  uVar2 = (this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>)
          .super_SmallVectorBase.Size;
  if (uVar2 < (this->
              super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>).
    super_SmallVectorBase.Size = uVar2 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }